

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O1

string * __thiscall picojson::value::to_str_abi_cxx11_(string *__return_storage_ptr__,value *this)

{
  char *pcVar1;
  bool bVar2;
  array *paVar3;
  pointer pvVar4;
  long lVar5;
  int iVar6;
  size_t sVar7;
  lconv *plVar8;
  long *plVar9;
  runtime_error *this_00;
  long *plVar10;
  size_type *psVar11;
  char *pcVar12;
  char *pcVar13;
  double dVar14;
  double __x;
  double tmp;
  char buf [256];
  long *local_188;
  long local_180;
  long local_178;
  long lStack_170;
  long *local_168 [2];
  long local_158 [2];
  double local_148;
  undefined8 uStack_140;
  double local_130;
  char local_128 [256];
  
  switch(this->type_) {
  case 0:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar13 = "null";
    pcVar12 = "";
    break;
  case 1:
    bVar2 = (this->u_).boolean_;
    pcVar13 = "false";
    if ((ulong)bVar2 != 0) {
      pcVar13 = "true";
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar12 = pcVar13 + ((ulong)bVar2 ^ 5);
    break;
  case 2:
    __x = (this->u_).number_;
    if (9007199254740992.0 <= ABS(__x)) {
      pcVar13 = "%.17g";
    }
    else {
      uStack_140 = 0;
      local_148 = __x;
      dVar14 = modf(__x,&local_130);
      pcVar13 = "%.f";
      if (dVar14 != 0.0) {
        pcVar13 = "%.17g";
      }
      __x = local_148;
      if (NAN(dVar14)) {
        pcVar13 = "%.17g";
      }
    }
    pcVar12 = local_128;
    snprintf(pcVar12,0x100,pcVar13,__x);
    plVar8 = localeconv();
    pcVar13 = plVar8->decimal_point;
    iVar6 = strcmp(pcVar13,".");
    if (iVar6 != 0) {
      sVar7 = strlen(pcVar13);
      while (local_128[0] != '\0') {
        iVar6 = strncmp(pcVar12,pcVar13,sVar7);
        if (iVar6 == 0) {
          local_168[0] = local_158;
          std::__cxx11::string::_M_construct<char*>((string *)local_168,local_128,pcVar12);
          plVar9 = (long *)std::__cxx11::string::append((char *)local_168);
          plVar10 = plVar9 + 2;
          if ((long *)*plVar9 == plVar10) {
            local_178 = *plVar10;
            lStack_170 = plVar9[3];
            local_188 = &local_178;
          }
          else {
            local_178 = *plVar10;
            local_188 = (long *)*plVar9;
          }
          local_180 = plVar9[1];
          *plVar9 = (long)plVar10;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_188);
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          psVar11 = (size_type *)(plVar9 + 2);
          if ((size_type *)*plVar9 == psVar11) {
            lVar5 = plVar9[3];
            (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
            *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar5;
          }
          else {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar9;
            (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
          }
          __return_storage_ptr__->_M_string_length = plVar9[1];
          *plVar9 = (long)psVar11;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          if (local_188 != &local_178) {
            operator_delete(local_188,local_178 + 1);
          }
          if (local_168[0] == local_158) {
            return __return_storage_ptr__;
          }
          operator_delete(local_168[0],local_158[0] + 1);
          return __return_storage_ptr__;
        }
        pcVar1 = pcVar12 + 1;
        pcVar12 = pcVar12 + 1;
        local_128[0] = *pcVar1;
      }
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    sVar7 = strlen(local_128);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,local_128,local_128 + sVar7);
    return __return_storage_ptr__;
  case 3:
    paVar3 = (this->u_).array_;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pvVar4 = (paVar3->super__Vector_base<picojson::value,_std::allocator<picojson::value>_>)._M_impl
             .super__Vector_impl_data._M_start;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pvVar4,
               (long)&((paVar3->
                       super__Vector_base<picojson::value,_std::allocator<picojson::value>_>).
                       _M_impl.super__Vector_impl_data._M_finish)->type_ + (long)pvVar4);
    return __return_storage_ptr__;
  case 4:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar13 = "array";
    pcVar12 = "";
    break;
  case 5:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar13 = "object";
    pcVar12 = "";
    break;
  case 6:
    pcVar13 = local_128;
    snprintf(pcVar13,0x15,"%ld",(this->u_).number_);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    sVar7 = strlen(pcVar13);
    pcVar12 = local_128 + sVar7;
    break;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"0");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar13,pcVar12);
  return __return_storage_ptr__;
}

Assistant:

inline std::string value::to_str() const {
  switch (type_) {
  case null_type:
    return "null";
  case boolean_type:
    return u_.boolean_ ? "true" : "false";
#ifdef PICOJSON_USE_INT64
  case int64_type: {
    char buf[sizeof("-9223372036854775808")];
    SNPRINTF(buf, sizeof(buf), "%" PRId64, u_.int64_);
    return buf;
  }
#endif
  case number_type: {
    char buf[256];
    double tmp;
    SNPRINTF(buf, sizeof(buf), fabs(u_.number_) < (1ULL << 53) && modf(u_.number_, &tmp) == 0 ? "%.f" : "%.17g", u_.number_);
#if PICOJSON_USE_LOCALE
    char *decimal_point = localeconv()->decimal_point;
    if (strcmp(decimal_point, ".") != 0) {
      size_t decimal_point_len = strlen(decimal_point);
      for (char *p = buf; *p != '\0'; ++p) {
        if (strncmp(p, decimal_point, decimal_point_len) == 0) {
          return std::string(buf, p) + "." + (p + decimal_point_len);
        }
      }
    }
#endif
    return buf;
  }
  case string_type:
    return *u_.string_;
  case array_type:
    return "array";
  case object_type:
    return "object";
  default:
    PICOJSON_ASSERT(0);
#ifdef _MSC_VER
    __assume(0);
#endif
  }
  return std::string();
}